

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O2

void __thiscall modified::restore(modified *this)

{
  int iVar1;
  int *piVar2;
  pointer pvVar3;
  pointer piVar4;
  pointer piVar5;
  branch_and_reduce_algorithm *pbVar6;
  iterator __begin1;
  int *piVar7;
  pointer piVar8;
  iterator __end1;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  pbVar6 = this->pAlg;
  pbVar6->crt = pbVar6->crt - this->add;
  piVar7 = (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar6->rn = pbVar6->rn + (int)((ulong)((long)piVar2 - (long)piVar7) >> 2);
  for (; piVar7 != piVar2; piVar7 = piVar7 + 1) {
    (pbVar6->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[*piVar7] = -1;
  }
  piVar8 = (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar12 = 0;
      lVar12 < (int)((ulong)((long)(this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar8) >> 2);
      lVar12 = lVar12 + 1) {
    std::vector<int,_std::allocator<int>_>::operator=
              ((pbVar6->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + piVar8[lVar12],
               (this->oldAdj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar12);
    piVar8 = (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar6 = this->pAlg;
    iVar1 = piVar8[lVar12];
    pvVar3 = (pbVar6->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (pbVar6->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = piVar4[iVar1];
    lVar10 = (long)iVar11;
    piVar5 = (pbVar6->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = piVar5[iVar1];
    for (piVar7 = pvVar3[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar7 != *(pointer *)
                   ((long)&pvVar3[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8); piVar7 = piVar7 + 1) {
      if (*piVar7 == iVar11) {
        iVar11 = -1;
      }
      if (*piVar7 == iVar9) {
        iVar9 = -1;
      }
    }
    if (-1 < iVar11) {
      piVar5[lVar10] = -1;
      piVar4[piVar8[lVar12]] = -1;
    }
    if (-1 < iVar9) {
      piVar4[piVar5[piVar8[lVar12]]] = -1;
      piVar5[piVar8[lVar12]] = -1;
    }
  }
  return;
}

Assistant:

void modified::restore() {
    pAlg->crt -= add;
    pAlg->rn += removed.size();
    for (int v : removed) pAlg->x[v] = -1;
    for (int i = 0; i < static_cast<int>(vs.size()); i++) {
        pAlg->adj[vs[i]] = oldAdj[i];
        int inV = pAlg->in[vs[i]], outV = pAlg->out[vs[i]];
        for (int u : pAlg->adj[vs[i]]) {
            if (u == inV) inV = -1;
            if (u == outV) outV = -1;
        }
        if (inV >= 0) {
            pAlg->out[pAlg->in[vs[i]]] = -1;
            pAlg->in[vs[i]] = -1;
        }
        if (outV >= 0) {
            pAlg->in[pAlg->out[vs[i]]] = -1;
            pAlg->out[vs[i]] = -1;
        }
    }
}